

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O1

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_1::getIVec3
          (anon_unknown_1 *this,Functions *gl,deUint32 pname)

{
  GLenum err;
  long *plVar1;
  long *plVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar3;
  int ndx;
  long lVar4;
  anon_unknown_1 *paVar5;
  IVec3 IVar6;
  long *local_a0;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  code *local_40;
  deUint32 local_38;
  
  *(undefined4 *)(this + 8) = 0xffffffff;
  *(undefined8 *)this = 0xffffffffffffffff;
  lVar4 = 0;
  paVar5 = this;
  do {
    (*gl->getIntegeri_v)(pname,(GLuint)lVar4,(GLint *)paVar5);
    lVar4 = lVar4 + 1;
    paVar5 = paVar5 + 4;
  } while (lVar4 != 3);
  err = (*gl->getError)();
  local_40 = glu::getGettableStateName;
  local_38 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1cccbbd);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
    local_80 = (long *)*plVar1;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_90 = *plVar2;
    lStack_88 = plVar1[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar2;
    local_a0 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  glu::checkError(err,(char *)local_a0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
                  ,0x51);
  iVar3 = extraout_EDX;
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
    iVar3 = extraout_EDX_00;
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
    iVar3 = extraout_EDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EDX_02;
  }
  IVar6.m_data[2] = iVar3;
  IVar6.m_data._0_8_ = this;
  return (IVec3)IVar6.m_data;
}

Assistant:

static tcu::IVec3 getIVec3 (const glw::Functions& gl, deUint32 pname)
{
	tcu::IVec3 value(-1);
	for (int ndx = 0; ndx < 3; ndx++)
		gl.getIntegeri_v(pname, (glw::GLuint)ndx, &value[ndx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegeri_v(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	return value;
}